

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresbund.cpp
# Opt level: O0

UResourceDataEntry * init_entry(char *localeID,char *path,UErrorCode *status)

{
  long lVar1;
  UBool UVar2;
  char *pcVar3;
  UResourceDataEntry *pUVar4;
  UErrorCode local_13c;
  void *pvStack_138;
  UErrorCode cacheStatus;
  UResourceDataEntry *oldR;
  UChar *alias;
  int32_t *poolIndexes;
  Resource aliasres;
  int32_t aliasLen;
  char aliasName [100];
  char *name;
  UResourceDataEntry find;
  UResourceDataEntry *r;
  UErrorCode *status_local;
  char *path_local;
  char *localeID_local;
  
  find.fBogus = U_ZERO_ERROR;
  find._116_4_ = 0;
  memset(&aliasres,0,100);
  poolIndexes._4_4_ = 0;
  UVar2 = U_FAILURE(*status);
  if (UVar2 != '\0') {
    return (UResourceDataEntry *)0x0;
  }
  if (localeID == (char *)0x0) {
    register0x00000000 = uloc_getDefault_63();
  }
  else {
    unique0x100002b5 = localeID;
    if (*localeID == '\0') {
      stack0xffffffffffffff50 = "root";
    }
  }
  name = stack0xffffffffffffff50;
  find.fName = path;
  find._112_8_ = uhash_get_63(cache,&name);
  if ((void *)find._112_8_ == (void *)0x0) {
    find._112_8_ = uprv_malloc_63(0x78);
    if ((void *)find._112_8_ == (void *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return (UResourceDataEntry *)0x0;
    }
    memset((void *)find._112_8_,0,0x78);
    setEntryName((UResourceDataEntry *)find._112_8_,stack0xffffffffffffff50,status);
    UVar2 = U_FAILURE(*status);
    if (UVar2 != '\0') {
      uprv_free_63((void *)find._112_8_);
      return (UResourceDataEntry *)0x0;
    }
    if (path != (char *)0x0) {
      pcVar3 = uprv_strdup_63(path);
      *(char **)(find._112_8_ + 8) = pcVar3;
      if (*(long *)(find._112_8_ + 8) == 0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        uprv_free_63((void *)find._112_8_);
        return (UResourceDataEntry *)0x0;
      }
    }
    res_load_63((ResourceData *)(find._112_8_ + 0x28),*(char **)(find._112_8_ + 8),
                *(char **)find._112_8_,status);
    UVar2 = U_FAILURE(*status);
    if (UVar2 == '\0') {
      if (*(char *)(find._112_8_ + 0x62) != '\0') {
        pUVar4 = getPoolEntry(*(char **)(find._112_8_ + 8),status);
        *(UResourceDataEntry **)(find._112_8_ + 0x20) = pUVar4;
        UVar2 = U_SUCCESS(*status);
        if (UVar2 == '\0') {
          *(UErrorCode *)(find._112_8_ + 0x70) = *status;
        }
        else {
          lVar1 = *(long *)(*(long *)(find._112_8_ + 0x20) + 0x30);
          alias = (UChar *)(lVar1 + 4);
          if (*(int *)(*(long *)(find._112_8_ + 0x30) + 0x20) == *(int *)(lVar1 + 0x20)) {
            *(UChar **)(find._112_8_ + 0x40) = alias + (long)(int)(*(uint *)alias & 0xff) * 2;
            *(undefined8 *)(find._112_8_ + 0x50) =
                 *(undefined8 *)(*(long *)(find._112_8_ + 0x20) + 0x38);
          }
          else {
            *status = U_INVALID_FORMAT_ERROR;
            *(undefined4 *)(find._112_8_ + 0x70) = 3;
          }
        }
      }
      UVar2 = U_SUCCESS(*status);
      if ((((UVar2 != '\0') &&
           (poolIndexes._0_4_ = res_getResource_63((ResourceData *)(find._112_8_ + 0x28),"%%ALIAS"),
           (Resource)poolIndexes != 0xffffffff)) &&
          (oldR = (UResourceDataEntry *)
                  res_getString_63((ResourceData *)(find._112_8_ + 0x28),(Resource)poolIndexes,
                                   (int32_t *)((long)&poolIndexes + 4)),
          oldR != (UResourceDataEntry *)0x0)) && (0 < poolIndexes._4_4_)) {
        u_UCharsToChars_63((UChar *)oldR,(char *)&aliasres,poolIndexes._4_4_ + 1);
        pUVar4 = init_entry((char *)&aliasres,path,status);
        *(UResourceDataEntry **)(find._112_8_ + 0x18) = pUVar4;
      }
    }
    else {
      if (*status == U_MEMORY_ALLOCATION_ERROR) {
        uprv_free_63((void *)find._112_8_);
        return (UResourceDataEntry *)0x0;
      }
      *status = U_ERROR_WARNING_START;
      *(undefined4 *)(find._112_8_ + 0x70) = 0xffffff80;
    }
    pvStack_138 = (void *)0x0;
    pvStack_138 = uhash_get_63(cache,(void *)find._112_8_);
    if (pvStack_138 == (void *)0x0) {
      local_13c = U_ZERO_ERROR;
      uhash_put_63(cache,(void *)find._112_8_,(void *)find._112_8_,&local_13c);
      UVar2 = U_FAILURE(local_13c);
      if (UVar2 != '\0') {
        *status = local_13c;
        free_entry((UResourceDataEntry *)find._112_8_);
        find.fBogus = U_ZERO_ERROR;
        find._116_4_ = 0;
      }
    }
    else {
      free_entry((UResourceDataEntry *)find._112_8_);
      find._112_8_ = pvStack_138;
    }
  }
  if (find._112_8_ != 0) {
    for (; *(long *)(find._112_8_ + 0x18) != 0; find._112_8_ = *(undefined8 *)(find._112_8_ + 0x18))
    {
    }
    *(int *)(find._112_8_ + 0x6c) = *(int *)(find._112_8_ + 0x6c) + 1;
    if ((*(int *)(find._112_8_ + 0x70) != 0) && (UVar2 = U_SUCCESS(*status), UVar2 != '\0')) {
      *status = *(UErrorCode *)(find._112_8_ + 0x70);
    }
  }
  return (UResourceDataEntry *)find._112_8_;
}

Assistant:

static UResourceDataEntry *init_entry(const char *localeID, const char *path, UErrorCode *status) {
    UResourceDataEntry *r = NULL;
    UResourceDataEntry find;
    /*int32_t hashValue;*/
    const char *name;
    char aliasName[100] = { 0 };
    int32_t aliasLen = 0;
    /*UBool isAlias = FALSE;*/
    /*UHashTok hashkey; */

    if(U_FAILURE(*status)) {
        return NULL;
    }

    /* here we try to deduce the right locale name */
    if(localeID == NULL) { /* if localeID is NULL, we're trying to open default locale */
        name = uloc_getDefault();
    } else if(*localeID == 0) { /* if localeID is "" then we try to open root locale */
        name = kRootLocaleName;
    } else { /* otherwise, we'll open what we're given */
        name = localeID;
    }

    find.fName = (char *)name;
    find.fPath = (char *)path;

    /* calculate the hash value of the entry */
    /*hashkey.pointer = (void *)&find;*/
    /*hashValue = hashEntry(hashkey);*/

    /* check to see if we already have this entry */
    r = (UResourceDataEntry *)uhash_get(cache, &find);
    if(r == NULL) {
        /* if the entry is not yet in the hash table, we'll try to construct a new one */
        r = (UResourceDataEntry *) uprv_malloc(sizeof(UResourceDataEntry));
        if(r == NULL) {
            *status = U_MEMORY_ALLOCATION_ERROR;
            return NULL;
        }

        uprv_memset(r, 0, sizeof(UResourceDataEntry));
        /*r->fHashKey = hashValue;*/

        setEntryName(r, name, status);
        if (U_FAILURE(*status)) {
            uprv_free(r);
            return NULL;
        }

        if(path != NULL) {
            r->fPath = (char *)uprv_strdup(path);
            if(r->fPath == NULL) {
                *status = U_MEMORY_ALLOCATION_ERROR;
                uprv_free(r);
                return NULL;
            }
        }

        /* this is the actual loading */
        res_load(&(r->fData), r->fPath, r->fName, status);

        if (U_FAILURE(*status)) {
            /* if we failed to load due to an out-of-memory error, exit early. */
            if (*status == U_MEMORY_ALLOCATION_ERROR) {
                uprv_free(r);
                return NULL;
            }
            /* we have no such entry in dll, so it will always use fallback */
            *status = U_USING_FALLBACK_WARNING;
            r->fBogus = U_USING_FALLBACK_WARNING;
        } else { /* if we have a regular entry */
            Resource aliasres;
            if (r->fData.usesPoolBundle) {
                r->fPool = getPoolEntry(r->fPath, status);
                if (U_SUCCESS(*status)) {
                    const int32_t *poolIndexes = r->fPool->fData.pRoot + 1;
                    if(r->fData.pRoot[1 + URES_INDEX_POOL_CHECKSUM] == poolIndexes[URES_INDEX_POOL_CHECKSUM]) {
                        r->fData.poolBundleKeys = (const char *)(poolIndexes + (poolIndexes[URES_INDEX_LENGTH] & 0xff));
                        r->fData.poolBundleStrings = r->fPool->fData.p16BitUnits;
                    } else {
                        r->fBogus = *status = U_INVALID_FORMAT_ERROR;
                    }
                } else {
                    r->fBogus = *status;
                }
            }
            if (U_SUCCESS(*status)) {
                /* handle the alias by trying to get out the %%Alias tag.*/
                /* We'll try to get alias string from the bundle */
                aliasres = res_getResource(&(r->fData), "%%ALIAS");
                if (aliasres != RES_BOGUS) {
                    const UChar *alias = res_getString(&(r->fData), aliasres, &aliasLen);
                    if(alias != NULL && aliasLen > 0) { /* if there is actual alias - unload and load new data */
                        u_UCharsToChars(alias, aliasName, aliasLen+1);
                        r->fAlias = init_entry(aliasName, path, status);
                    }
                }
            }
        }

        {
            UResourceDataEntry *oldR = NULL;
            if((oldR = (UResourceDataEntry *)uhash_get(cache, r)) == NULL) { /* if the data is not cached */
                /* just insert it in the cache */
                UErrorCode cacheStatus = U_ZERO_ERROR;
                uhash_put(cache, (void *)r, r, &cacheStatus);
                if (U_FAILURE(cacheStatus)) {
                    *status = cacheStatus;
                    free_entry(r);
                    r = NULL;
                }
            } else {
                /* somebody have already inserted it while we were working, discard newly opened data */
                /* Also, we could get here IF we opened an alias */
                free_entry(r);
                r = oldR;
            }
        }

    }
    if(r != NULL) {
        /* return the real bundle */
        while(r->fAlias != NULL) {
            r = r->fAlias;
        }
        r->fCountExisting++; /* we increase its reference count */
        /* if the resource has a warning */
        /* we don't want to overwrite a status with no error */
        if(r->fBogus != U_ZERO_ERROR && U_SUCCESS(*status)) {
             *status = r->fBogus; /* set the returning status */
        }
    }
    return r;
}